

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessProgramPipelinesTests.cpp
# Opt level: O1

void __thiscall gl4cts::DirectStateAccess::ProgramPipelines::DefaultsTest::clean(DefaultsTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_program_pipeline_dsa != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x450))(1,&this->m_program_pipeline_dsa);
    this->m_program_pipeline_dsa = 0;
  }
  return;
}

Assistant:

void DefaultsTest::clean()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_program_pipeline_dsa)
	{
		gl.deleteProgramPipelines(1, &m_program_pipeline_dsa);

		m_program_pipeline_dsa = 0;
	}
}